

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::FragmentOutExecutor::addAttribute
          (FragmentOutExecutor *this,deUint32 bindingLocation,VkFormat format,
          deUint32 sizePerElement,deUint32 count,void *dataPtr)

{
  Allocation *ptr;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  Allocator *pAVar1;
  Unique<vk::Handle<(vk::HandleType)8>_> *ptr_00;
  ulong __n;
  deUint32 dVar2;
  Allocation *local_e0 [2];
  VkMemoryRequirements local_d0;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  deUint32 queueFamilyIndex;
  VkVertexInputBindingDescription bindingDescription;
  VkVertexInputAttributeDescription attributeDescription;
  VkBufferCreateInfo vertexBufferParams;
  
  dVar2 = (deUint32)
          (((long)(this->m_vertexBindingDescriptions).
                  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_vertexBindingDescriptions).
                 super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  bindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  bindingDescription.binding = dVar2;
  bindingDescription.stride = sizePerElement;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::push_back(&this->m_vertexBindingDescriptions,&bindingDescription);
  attributeDescription.offset = 0;
  attributeDescription.location = bindingLocation;
  attributeDescription.binding = dVar2;
  attributeDescription.format = format;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(&this->m_vertexAttributeDescriptions,&attributeDescription);
  device = Context::getDevice((this->super_ShaderExecutor).m_context);
  vk = Context::getDeviceInterface((this->super_ShaderExecutor).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_ShaderExecutor).m_context);
  vertexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.pNext = (void *)0x0;
  __n = (ulong)(count * sizePerElement);
  vertexBufferParams.flags = 0;
  vertexBufferParams.usage = 0x80;
  vertexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vertexBufferParams.queueFamilyIndexCount = 1;
  vertexBufferParams.size = __n;
  ::vk::createBuffer(&buffer,vk,device,&vertexBufferParams,(VkAllocationCallbacks *)0x0);
  pAVar1 = Context::getDefaultAllocator((this->super_ShaderExecutor).m_context);
  ::vk::getBufferMemoryRequirements
            (&local_d0,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar1->_vptr_Allocator[3])(local_e0,pAVar1,&local_d0,1);
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                      (local_e0[0]->m_memory).m_internal,local_e0[0]->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                    ,0x275);
  memcpy(local_e0[0]->m_hostPtr,dataPtr,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(local_e0[0]->m_memory).m_internal,local_e0[0]->m_offset,__n)
  ;
  ptr_00 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&local_d0,ptr_00)
  ;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
  ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
              *)&this->m_vertexBuffers,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&local_d0);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::release
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&local_d0);
  ptr = local_e0[0];
  local_e0[0] = (Allocation *)0x0;
  de::SharedPtr<vk::Allocation>::SharedPtr((SharedPtr<vk::Allocation> *)&local_d0,ptr);
  std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
  emplace_back<de::SharedPtr<vk::Allocation>>
            ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>> *)
             &this->m_vertexBufferAllocs,(SharedPtr<vk::Allocation> *)&local_d0);
  de::SharedPtr<vk::Allocation>::~SharedPtr((SharedPtr<vk::Allocation> *)&local_d0);
  if (local_e0[0] != (Allocation *)0x0) {
    (*local_e0[0]->_vptr_Allocation[1])();
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return;
}

Assistant:

void FragmentOutExecutor::addAttribute (deUint32 bindingLocation, VkFormat format, deUint32 sizePerElement, deUint32 count, const void* dataPtr)
{
	// Add binding specification
	const deUint32							binding = (deUint32)m_vertexBindingDescriptions.size();
	const VkVertexInputBindingDescription	bindingDescription =
	{
		binding,
		sizePerElement,
		VK_VERTEX_INPUT_RATE_VERTEX
	};

	m_vertexBindingDescriptions.push_back(bindingDescription);

	// Add location and format specification
	const VkVertexInputAttributeDescription attributeDescription =
	{
		bindingLocation,			// deUint32	location;
		binding,					// deUint32	binding;
		format,						// VkFormat	format;
		0u,							// deUint32	offsetInBytes;
	};

	m_vertexAttributeDescriptions.push_back(attributeDescription);

	// Upload data to buffer
	const VkDevice				vkDevice			= m_context.getDevice();
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize			inputSize			= sizePerElement * count;
	const VkBufferCreateInfo	vertexBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		inputSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyCount;
		&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>			buffer	= createBuffer(vk, vkDevice, &vertexBufferParams);
	de::MovePtr<Allocation>	alloc	= m_context.getDefaultAllocator().allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);

	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset()));

	deMemcpy(alloc->getHostPtr(), dataPtr, (size_t)inputSize);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), inputSize);

	m_vertexBuffers.push_back(de::SharedPtr<Unique<VkBuffer> >(new Unique<VkBuffer>(buffer)));
	m_vertexBufferAllocs.push_back(AllocationSp(alloc.release()));
}